

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O0

void poptJlu32lpair(void *key,size_t size,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *local_60;
  uint8_t *k_2;
  uint8_t *k8;
  uint16_t *k_1;
  uint32_t *k;
  uint local_38;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  anon_union_8_2_f9ecd746 u;
  uint32_t *pb_local;
  uint32_t *pc_local;
  size_t size_local;
  void *key_local;
  
  local_38 = (int)size + -0x21524111 + *pc;
  k._4_4_ = local_38;
  if (key != (void *)0x0) {
    k._4_4_ = *pb + local_38;
    k_1 = (uint16_t *)key;
    c = local_38;
    pc_local = (uint32_t *)size;
    if (((ulong)key & 3) == 0) {
      for (; (uint32_t *)0xc < pc_local; pc_local = pc_local + -3) {
        uVar1 = *(int *)(k_1 + 4) + k._4_4_;
        uVar2 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (*(int *)k_1 + c) - uVar1;
        iVar3 = *(int *)(k_1 + 2) + local_38 + uVar1;
        uVar1 = (uVar2 << 6 | uVar2 >> 0x1a) ^ (*(int *)(k_1 + 2) + local_38) - uVar2;
        iVar4 = iVar3 + uVar2;
        uVar2 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar3 - uVar1;
        iVar3 = iVar4 + uVar1;
        uVar1 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar4 - uVar2;
        iVar4 = iVar3 + uVar2;
        local_38 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar3 - uVar1;
        c = iVar4 + uVar1;
        k._4_4_ = (local_38 << 4 | local_38 >> 0x1c) ^ iVar4 - local_38;
        local_38 = c + local_38;
        k_1 = k_1 + 6;
      }
      switch(pc_local) {
      case (uint32_t *)0x0:
        goto LAB_0010b69f;
      case (uint32_t *)0x1:
        c = (*(uint *)k_1 & 0xff) + c;
        break;
      case (uint32_t *)0x2:
        c = (*(uint *)k_1 & 0xffff) + c;
        break;
      case (uint32_t *)0x3:
        c = (*(uint *)k_1 & 0xffffff) + c;
        break;
      case (uint32_t *)0x4:
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0x5:
        local_38 = (*(uint *)(k_1 + 2) & 0xff) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0x6:
        local_38 = (*(uint *)(k_1 + 2) & 0xffff) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0x7:
        local_38 = (*(uint *)(k_1 + 2) & 0xffffff) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0x8:
        local_38 = *(int *)(k_1 + 2) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0x9:
        k._4_4_ = (*(uint *)(k_1 + 4) & 0xff) + k._4_4_;
        local_38 = *(int *)(k_1 + 2) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0xa:
        k._4_4_ = (*(uint *)(k_1 + 4) & 0xffff) + k._4_4_;
        local_38 = *(int *)(k_1 + 2) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0xb:
        k._4_4_ = (*(uint *)(k_1 + 4) & 0xffffff) + k._4_4_;
        local_38 = *(int *)(k_1 + 2) + local_38;
        c = *(int *)k_1 + c;
        break;
      case (uint32_t *)0xc:
        k._4_4_ = *(int *)(k_1 + 4) + k._4_4_;
        local_38 = *(int *)(k_1 + 2) + local_38;
        c = *(int *)k_1 + c;
      }
    }
    else {
      local_60 = (byte *)key;
      k8 = (uint8_t *)key;
      if (((ulong)key & 1) == 0) {
        for (; (uint32_t *)0xc < pc_local; pc_local = pc_local + -3) {
          iVar3 = (uint)*(ushort *)(k8 + 4) + (uint)*(ushort *)(k8 + 6) * 0x10000 + local_38;
          uVar1 = (uint)*(ushort *)(k8 + 8) + (uint)*(ushort *)(k8 + 10) * 0x10000 + k._4_4_;
          uVar2 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^
                  ((uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c) - uVar1;
          iVar4 = iVar3 + uVar1;
          uVar1 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar3 - uVar2;
          iVar3 = iVar4 + uVar2;
          uVar2 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar4 - uVar1;
          iVar4 = iVar3 + uVar1;
          uVar1 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar3 - uVar2;
          iVar3 = iVar4 + uVar2;
          local_38 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar4 - uVar1;
          c = iVar3 + uVar1;
          k._4_4_ = (local_38 << 4 | local_38 >> 0x1c) ^ iVar3 - local_38;
          local_38 = c + local_38;
          k8 = k8 + 0xc;
        }
        switch(pc_local) {
        case (uint32_t *)0x0:
          goto LAB_0010b69f;
        case (uint32_t *)0x1:
          c = *k8 + c;
          break;
        case (uint32_t *)0x3:
          c = (uint)k8[2] * 0x10000 + c;
        case (uint32_t *)0x2:
          c = *(ushort *)k8 + c;
          break;
        case (uint32_t *)0x5:
          local_38 = k8[4] + local_38;
        case (uint32_t *)0x4:
          c = (uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c;
          break;
        case (uint32_t *)0x7:
          local_38 = (uint)k8[6] * 0x10000 + local_38;
        case (uint32_t *)0x6:
          local_38 = *(ushort *)(k8 + 4) + local_38;
          c = (uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c;
          break;
        case (uint32_t *)0x9:
          k._4_4_ = k8[8] + k._4_4_;
        case (uint32_t *)0x8:
          local_38 = (uint)*(ushort *)(k8 + 4) + (uint)*(ushort *)(k8 + 6) * 0x10000 + local_38;
          c = (uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c;
          break;
        case (uint32_t *)0xb:
          k._4_4_ = (uint)k8[10] * 0x10000 + k._4_4_;
        case (uint32_t *)0xa:
          k._4_4_ = *(ushort *)(k8 + 8) + k._4_4_;
          local_38 = (uint)*(ushort *)(k8 + 4) + (uint)*(ushort *)(k8 + 6) * 0x10000 + local_38;
          c = (uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c;
          break;
        case (uint32_t *)0xc:
          k._4_4_ = (uint)*(ushort *)(k8 + 8) + (uint)*(ushort *)(k8 + 10) * 0x10000 + k._4_4_;
          local_38 = (uint)*(ushort *)(k8 + 4) + (uint)*(ushort *)(k8 + 6) * 0x10000 + local_38;
          c = (uint)*(ushort *)k8 + (uint)*(ushort *)(k8 + 2) * 0x10000 + c;
        }
      }
      else {
        for (; (uint32_t *)0xc < pc_local; pc_local = pc_local + -3) {
          iVar3 = (uint)local_60[7] * 0x1000000 +
                  (uint)local_60[6] * 0x10000 + (uint)local_60[5] * 0x100 + local_60[4] + local_38;
          uVar1 = (uint)local_60[0xb] * 0x1000000 +
                  (uint)local_60[10] * 0x10000 + (uint)local_60[9] * 0x100 + local_60[8] + k._4_4_;
          uVar2 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^
                  ((uint)local_60[3] * 0x1000000 +
                  (uint)local_60[2] * 0x10000 + (uint)local_60[1] * 0x100 + *local_60 + c) - uVar1;
          iVar4 = iVar3 + uVar1;
          uVar1 = (uVar2 << 6 | uVar2 >> 0x1a) ^ iVar3 - uVar2;
          iVar3 = iVar4 + uVar2;
          uVar2 = (uVar1 << 8 | uVar1 >> 0x18) ^ iVar4 - uVar1;
          iVar4 = iVar3 + uVar1;
          uVar1 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar3 - uVar2;
          iVar3 = iVar4 + uVar2;
          local_38 = (uVar1 << 0x13 | uVar1 >> 0xd) ^ iVar4 - uVar1;
          c = iVar3 + uVar1;
          k._4_4_ = (local_38 << 4 | local_38 >> 0x1c) ^ iVar3 - local_38;
          local_38 = c + local_38;
          local_60 = local_60 + 0xc;
        }
        switch(pc_local) {
        case (uint32_t *)0x0:
          goto LAB_0010b69f;
        case (uint32_t *)0xc:
          k._4_4_ = (uint)local_60[0xb] * 0x1000000 + k._4_4_;
        case (uint32_t *)0xb:
          k._4_4_ = (uint)local_60[10] * 0x10000 + k._4_4_;
        case (uint32_t *)0xa:
          k._4_4_ = (uint)local_60[9] * 0x100 + k._4_4_;
        case (uint32_t *)0x9:
          k._4_4_ = local_60[8] + k._4_4_;
        case (uint32_t *)0x8:
          local_38 = (uint)local_60[7] * 0x1000000 + local_38;
        case (uint32_t *)0x7:
          local_38 = (uint)local_60[6] * 0x10000 + local_38;
        case (uint32_t *)0x6:
          local_38 = (uint)local_60[5] * 0x100 + local_38;
        case (uint32_t *)0x5:
          local_38 = local_60[4] + local_38;
        case (uint32_t *)0x4:
          c = (uint)local_60[3] * 0x1000000 + c;
        case (uint32_t *)0x3:
          c = (uint)local_60[2] * 0x10000 + c;
        case (uint32_t *)0x2:
          c = (uint)local_60[1] * 0x100 + c;
        case (uint32_t *)0x1:
          c = *local_60 + c;
        }
      }
    }
    uVar1 = (local_38 ^ k._4_4_) - (local_38 << 0xe | local_38 >> 0x12);
    uVar2 = (uVar1 ^ c) - (uVar1 * 0x800 | uVar1 >> 0x15);
    uVar5 = (uVar2 ^ local_38) - (uVar2 * 0x2000000 | uVar2 >> 7);
    uVar1 = (uVar5 ^ uVar1) - (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar2 = (uVar1 ^ uVar2) - (uVar1 * 0x10 | uVar1 >> 0x1c);
    local_38 = (uVar2 ^ uVar5) - (uVar2 * 0x4000 | uVar2 >> 0x12);
    k._4_4_ = (local_38 ^ uVar1) - (local_38 * 0x1000000 | local_38 >> 8);
  }
LAB_0010b69f:
  *pc = k._4_4_;
  *pb = local_38;
  return;
}

Assistant:

void jlu32lpair(const void *key, size_t size, uint32_t *pc, uint32_t *pb)
{
    union { const void *ptr; size_t i; } u;
    uint32_t a = _JLU3_INIT(*pc, size);
    uint32_t b = a;
    uint32_t c = a;

    if (key == NULL)
	goto exit;

    c += *pb;	/* Add the secondary hash. */

    u.ptr = key;
    if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
	const uint32_t *k = (const uint32_t *)key;	/* read 32-bit chunks */
#ifdef	VALGRIND
	const uint8_t  *k8;
#endif

	/*-- all but last block: aligned reads and affect 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    b += k[1];
	    c += k[2];
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 3;
	}
	/*------------------------- handle the last (probably partial) block */
	/* 
	 * "k[2]&0xffffff" actually reads beyond the end of the string, but
	 * then masks off the part it's not allowed to read.  Because the
	 * string is aligned, the masked-off tail is in the same word as the
	 * rest of the string.  Every machine with memory protection I've seen
	 * does it on word boundaries, so is OK with this.  But VALGRIND will
	 * still catch it and complain.  The masking trick does make the hash
	 * noticeably faster for short strings (like English words).
	 */
#ifndef VALGRIND

	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0]; break;
	case 11:	c += k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
	case 10:	c += k[2]&0xffff; b+=k[1]; a+=k[0]; break;
	case  9:	c += k[2]&0xff; b+=k[1]; a+=k[0]; break;
	case  8:	b += k[1]; a+=k[0]; break;
	case  7:	b += k[1]&0xffffff; a+=k[0]; break;
	case  6:	b += k[1]&0xffff; a+=k[0]; break;
	case  5:	b += k[1]&0xff; a+=k[0]; break;
	case  4:	a += k[0]; break;
	case  3:	a += k[0]&0xffffff; break;
	case  2:	a += k[0]&0xffff; break;
	case  1:	a += k[0]&0xff; break;
	case  0:	goto exit;
	}

#else /* make valgrind happy */

	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:	c += k[2]; b+=k[1]; a+=k[0];	break;
	case 11:	c += ((uint32_t)k8[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k8[9])<<8;	/* fallthrough */
	case  9:	c += k8[8];			/* fallthrough */
	case  8:	b += k[1]; a+=k[0];		break;
	case  7:	b += ((uint32_t)k8[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k8[5])<<8;	/* fallthrough */
	case  5:	b += k8[4];			/* fallthrough */
	case  4:	a += k[0];			break;
	case  3:	a += ((uint32_t)k8[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k8[1])<<8;	/* fallthrough */
	case  1:	a += k8[0];			break;
	case  0:	goto exit;
	}

#endif /* !valgrind */

    } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
	const uint16_t *k = (const uint16_t *)key;	/* read 16-bit chunks */
	const uint8_t  *k8;

	/*----------- all but last block: aligned reads and different mixing */
	while (size > (size_t)12) {
	    a += k[0] + (((uint32_t)k[1])<<16);
	    b += k[2] + (((uint32_t)k[3])<<16);
	    c += k[4] + (((uint32_t)k[5])<<16);
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 6;
	}

	/*------------------------- handle the last (probably partial) block */
	k8 = (const uint8_t *)k;
	switch (size) {
	case 12:
	    c += k[4]+(((uint32_t)k[5])<<16);
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case 11:
	    c += ((uint32_t)k8[10])<<16;
	    /* fallthrough */
	case 10:
	    c += k[4];
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  9:
	    c += k8[8];
	    /* fallthrough */
	case  8:
	    b += k[2]+(((uint32_t)k[3])<<16);
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  7:
	    b += ((uint32_t)k8[6])<<16;
	    /* fallthrough */
	case  6:
	    b += k[2];
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  5:
	    b += k8[4];
	    /* fallthrough */
	case  4:
	    a += k[0]+(((uint32_t)k[1])<<16);
	    break;
	case  3:
	    a += ((uint32_t)k8[2])<<16;
	    /* fallthrough */
	case  2:
	    a += k[0];
	    break;
	case  1:
	    a += k8[0];
	    break;
	case  0:
	    goto exit;
	}

    } else {		/* need to read the key one byte at a time */
	const uint8_t *k = (const uint8_t *)key;

	/*----------- all but the last block: affect some 32 bits of (a,b,c) */
	while (size > (size_t)12) {
	    a += k[0];
	    a += ((uint32_t)k[1])<<8;
	    a += ((uint32_t)k[2])<<16;
	    a += ((uint32_t)k[3])<<24;
	    b += k[4];
	    b += ((uint32_t)k[5])<<8;
	    b += ((uint32_t)k[6])<<16;
	    b += ((uint32_t)k[7])<<24;
	    c += k[8];
	    c += ((uint32_t)k[9])<<8;
	    c += ((uint32_t)k[10])<<16;
	    c += ((uint32_t)k[11])<<24;
	    _JLU3_MIX(a,b,c);
	    size -= 12;
	    k += 12;
	}

	/*---------------------------- last block: affect all 32 bits of (c) */
	switch (size) {
	case 12:	c += ((uint32_t)k[11])<<24;	/* fallthrough */
	case 11:	c += ((uint32_t)k[10])<<16;	/* fallthrough */
	case 10:	c += ((uint32_t)k[9])<<8;	/* fallthrough */
	case  9:	c += k[8];			/* fallthrough */
	case  8:	b += ((uint32_t)k[7])<<24;	/* fallthrough */
	case  7:	b += ((uint32_t)k[6])<<16;	/* fallthrough */
	case  6:	b += ((uint32_t)k[5])<<8;	/* fallthrough */
	case  5:	b += k[4];			/* fallthrough */
	case  4:	a += ((uint32_t)k[3])<<24;	/* fallthrough */
	case  3:	a += ((uint32_t)k[2])<<16;	/* fallthrough */
	case  2:	a += ((uint32_t)k[1])<<8;	/* fallthrough */
	case  1:	a += k[0];
	    break;
	case  0:
	    goto exit;
	}
    }

    _JLU3_FINAL(a,b,c);

exit:
    *pc = c;
    *pb = b;
    return;
}